

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O1

size_t duckdb_je_extent_sn_next(pac_t *pac)

{
  atomic_zu_t *paVar1;
  size_t sVar2;
  
  LOCK();
  paVar1 = &pac->duckdb_je_extent_sn_next;
  sVar2 = paVar1->repr;
  paVar1->repr = paVar1->repr + 1;
  UNLOCK();
  return sVar2;
}

Assistant:

size_t
extent_sn_next(pac_t *pac) {
	return atomic_fetch_add_zu(&pac->extent_sn_next, 1, ATOMIC_RELAXED);
}